

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O1

string * __thiscall
Chart::renderSubTotal(string *__return_storage_ptr__,Chart *this,time_t total_work,string *padding)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream oVar3;
  ostream *poVar4;
  ostream *poVar5;
  stringstream out;
  char local_221;
  string local_220;
  string local_200;
  Color local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  auVar2 = SEXT816(total_work % 0xe10) * ZEXT816(0x8888888888888889);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(padding->_M_dataplus)._M_p,padding->_M_string_length);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"underline","");
  Color::Color(&local_1e0,&local_200);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"      ","");
  Color::colorize(&local_1d8,&local_1e0,&local_220);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  local_221 = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_221,1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(padding->_M_dataplus)._M_p,padding->_M_string_length);
  lVar1 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 3;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = poVar4 + lVar1;
  if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x20;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(total_work / 0xe10));
  local_221 = ':';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_221,1);
  lVar1 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = poVar4 + lVar1;
  if (poVar4[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x30;
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f));
  local_221 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_221,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderSubTotal (
  time_t total_work,
  const std::string& padding)
{
  std::stringstream out;

  int hours = total_work / 3600;
  int minutes = (total_work % 3600) / 60;

  out << padding
      << Color ("underline").colorize ("      ")
      << '\n'
      << padding
      << std::setw (3) << std::setfill (' ') << hours
      << ':'
      << std::setw (2) << std::setfill ('0') << minutes
      << '\n';

  return out.str ();
}